

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_node.c
# Opt level: O3

REF_STATUS ref_node_xyz_normal(REF_DBL *xyz0,REF_DBL *xyz1,REF_DBL *xyz2,REF_DBL *normal)

{
  REF_STATUS in_EAX;
  double dVar1;
  double dVar2;
  double dVar3;
  double dVar4;
  double dVar5;
  double dVar6;
  
  dVar1 = *xyz1 - *xyz0;
  dVar3 = xyz1[1] - xyz0[1];
  dVar4 = xyz1[2] - xyz0[2];
  dVar2 = xyz2[1] - xyz0[1];
  dVar5 = xyz2[2] - xyz0[2];
  dVar6 = *xyz2 - *xyz0;
  *normal = dVar3 * dVar5 - dVar2 * dVar4;
  normal[1] = dVar4 * dVar6 - dVar5 * dVar1;
  normal[2] = dVar1 * dVar2 - dVar6 * dVar3;
  return in_EAX;
}

Assistant:

REF_FCN static REF_STATUS ref_node_xyz_normal(REF_DBL *xyz0, REF_DBL *xyz1,
                                              REF_DBL *xyz2, REF_DBL *normal) {
  REF_DBL edge10[3], edge20[3];

  edge10[0] = xyz1[0] - xyz0[0];
  edge10[1] = xyz1[1] - xyz0[1];
  edge10[2] = xyz1[2] - xyz0[2];

  edge20[0] = xyz2[0] - xyz0[0];
  edge20[1] = xyz2[1] - xyz0[1];
  edge20[2] = xyz2[2] - xyz0[2];

  ref_math_cross_product(edge10, edge20, normal);

  return REF_SUCCESS;
}